

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.cpp
# Opt level: O2

PureFunctionCall * __thiscall
soul::BlockBuilder::createMinInt32(BlockBuilder *this,Expression *a,Expression *b)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Module *m;
  Function *args_1;
  PureFunctionCall *pPVar2;
  allocator<char> local_81;
  Type local_80;
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  iVar1 = (*(a->super_Object)._vptr_Object[2])(a);
  if (*(int *)(CONCAT44(extraout_var,iVar1) + 4) == 7) {
    iVar1 = (*(b->super_Object)._vptr_Object[2])(b);
    if (*(int *)(CONCAT44(extraout_var_00,iVar1) + 4) == 7) {
      m = anon_unknown.dwarf_b13d7::getInternalModule(&this->module->program);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"_minInt32",&local_81);
      local_80.category = primitive;
      local_80.arrayElementCategory = invalid;
      local_80.isRef = false;
      local_80.isConstant = false;
      local_80.primitiveType.type = int32;
      local_80.boundingSize = 0;
      local_80.arrayElementBoundingSize = 0;
      local_80.structure.object = (Structure *)0x0;
      local_48._M_unused._M_object = (void *)0x0;
      local_48._8_8_ = 0;
      local_30 = std::
                 _Function_handler<void_(soul::FunctionBuilder_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_heart_FunctionBuilder.cpp:46:116)>
                 ::_M_invoke;
      local_38 = std::
                 _Function_handler<void_(soul::FunctionBuilder_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_heart_FunctionBuilder.cpp:46:116)>
                 ::_M_manager;
      args_1 = FunctionBuilder::getOrCreateFunction
                         (m,&local_68,&local_80,
                          (function<void_(soul::FunctionBuilder_&)> *)&local_48);
      std::_Function_base::~_Function_base((_Function_base *)&local_48);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_80.structure);
      std::__cxx11::string::~string((string *)&local_68);
      pPVar2 = Module::
               allocate<soul::heart::PureFunctionCall,soul::CodeLocation&,soul::heart::Function&>
                         (this->module,&(a->super_Object).location,args_1);
      local_68._M_dataplus._M_p = (pointer)a;
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>::
      push_back<soul::heart::Expression&>
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul> *)
                 &pPVar2->arguments,(pool_ref<soul::heart::Expression> *)&local_68,b);
      return pPVar2;
    }
  }
  throwInternalCompilerError
            ("a.getType().isInteger32() && b.getType().isInteger32()","createMinInt32",0x2a);
}

Assistant:

heart::PureFunctionCall& BlockBuilder::createMinInt32 (heart::Expression& a, heart::Expression& b)
{
    SOUL_ASSERT (a.getType().isInteger32() && b.getType().isInteger32());

    auto& internalModule = getInternalModule (module.program);

    auto& function = soul::FunctionBuilder::getOrCreateFunction (internalModule, minInt32Fn, PrimitiveType::int32, [] (FunctionBuilder& builder)
    {
        auto& paramA = builder.addParameter ("a", PrimitiveType::int32);
        auto& paramB = builder.addParameter ("b", PrimitiveType::int32);

        auto& lessThan = builder.createBlock ("@lessThan");
        auto& moreThan = builder.createBlock ("@moreThan");

        builder.addBranchIf (builder.createComparisonOp (paramA, paramB, BinaryOp::Op::lessThan), lessThan, moreThan, lessThan);
        builder.addReturn (paramA);
        builder.beginBlock (moreThan);
        builder.addReturn (paramB);
    });

    auto& call = module.allocate<heart::PureFunctionCall> (a.location, function);
    call.arguments.push_back (a, b);
    return call;
}